

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeAdapter.cpp
# Opt level: O3

FluctuatingAtypeParameters * __thiscall
OpenMD::FluctuatingChargeAdapter::getFluctuatingChargeParam
          (FluctuatingAtypeParameters *__return_storage_ptr__,FluctuatingChargeAdapter *this)

{
  RealType RVar1;
  undefined8 uVar2;
  RealType RVar3;
  RealType RVar4;
  RealType RVar5;
  RealType RVar6;
  RealType RVar7;
  bool bVar8;
  long lVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  shared_ptr<OpenMD::GenericData> data;
  undefined1 local_50 [16];
  string local_40;
  
  bVar8 = AtomType::hasProperty(this->at_,(string *)FQtypeID_abi_cxx11_);
  if (!bVar8) {
    AtomType::getName_abi_cxx11_(&local_40,this->at_);
    snprintf(painCave.errMsg,2000,
             "FluctuatingChargeAdapter::getFluctuatingChargeParam was passed an atomType (%s)\n\tthat does not appear to be a fluctuating charge atom.\n"
             ,local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)local_50,(string *)this->at_);
  if ((_func_int **)local_50._0_8_ == (_func_int **)0x0) {
    AtomType::getName_abi_cxx11_(&local_40,this->at_);
    snprintf(painCave.errMsg,2000,
             "FluctuatingChargeAdapter::getFluctuatingChargeParam could not find fluctuating charge\n\tparameters for atomType %s.\n"
             ,local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    if ((_func_int **)local_50._0_8_ != (_func_int **)0x0) goto LAB_001bcd7c;
  }
  else {
LAB_001bcd7c:
    lVar9 = __dynamic_cast(local_50._0_8_,&GenericData::typeinfo,
                           &SimpleTypeData<OpenMD::FluctuatingAtypeParameters>::typeinfo,0);
    if (lVar9 != 0) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_;
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_50._8_8_ + 8) = *(_Atomic_word *)(local_50._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_50._8_8_ + 8) = *(_Atomic_word *)(local_50._8_8_ + 8) + 1;
        }
      }
      goto LAB_001bce25;
    }
  }
  AtomType::getName_abi_cxx11_(&local_40,this->at_);
  snprintf(painCave.errMsg,2000,
           "FluctuatingChargeAdapter::getFluctuatingChargeParam could not convert\n\tGenericData to FluctuatingAtypeData for atom type %s\n"
           ,local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  painCave.isFatal = 1;
  painCave.severity = 1;
  simError();
  p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  lVar9 = 0;
LAB_001bce25:
  RVar1 = *(RealType *)(lVar9 + 0x28);
  uVar2 = *(undefined8 *)(lVar9 + 0x30);
  RVar3 = *(RealType *)(lVar9 + 0x38);
  RVar4 = *(RealType *)(lVar9 + 0x40);
  RVar5 = *(RealType *)(lVar9 + 0x48);
  RVar6 = *(RealType *)(lVar9 + 0x50);
  RVar7 = *(RealType *)(lVar9 + 0x60);
  *(undefined8 *)&__return_storage_ptr__->slaterN = *(undefined8 *)(lVar9 + 0x58);
  __return_storage_ptr__->slaterZeta = RVar7;
  __return_storage_ptr__->electronegativity = RVar5;
  __return_storage_ptr__->hardness = RVar6;
  __return_storage_ptr__->nValence = RVar3;
  __return_storage_ptr__->nMobile = RVar4;
  __return_storage_ptr__->chargeMass = RVar1;
  __return_storage_ptr__->isMetallic = (bool)(char)uVar2;
  __return_storage_ptr__->usesSlaterIntramolecular = (bool)(char)((ulong)uVar2 >> 8);
  *(int6 *)&__return_storage_ptr__->field_0xa = (int6)((ulong)uVar2 >> 0x10);
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::_Rb_tree((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
              *)&__return_storage_ptr__->vself,
             (_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
              *)(lVar9 + 0x68));
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

FluctuatingAtypeParameters
      FluctuatingChargeAdapter::getFluctuatingChargeParam() {
    if (!isFluctuatingCharge()) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "FluctuatingChargeAdapter::getFluctuatingChargeParam was passed an "
          "atomType "
          "(%s)\n"
          "\tthat does not appear to be a fluctuating charge atom.\n",
          at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(FQtypeID);
    if (data == nullptr) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "FluctuatingChargeAdapter::getFluctuatingChargeParam could not find "
          "fluctuating charge\n"
          "\tparameters for atomType %s.\n",
          at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<FluctuatingAtypeData> fqData =
        std::dynamic_pointer_cast<FluctuatingAtypeData>(data);
    if (fqData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "FluctuatingChargeAdapter::getFluctuatingChargeParam could not "
               "convert\n"
               "\tGenericData to FluctuatingAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return fqData->getData();
  }